

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O3

ktx_error_code_e ktxHashList_AddKVPair(ktxHashList *pHead,char *key,uint valueLen,void *value)

{
  UT_hash_bucket *pUVar1;
  uint *puVar2;
  UT_hash_table *pUVar3;
  UT_hash_handle *pUVar4;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  uint uVar7;
  size_t sVar8;
  ktxHashList pkVar9;
  UT_hash_table *pUVar10;
  ktxHashList pkVar11;
  UT_hash_bucket *pUVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  UT_hash_handle *pUVar17;
  ktx_error_code_e kVar18;
  ktx_error_code_e kVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  char *_hj_key;
  void *__dest;
  ktxHashList __dest_00;
  uint uVar23;
  
  kVar19 = KTX_INVALID_VALUE;
  if ((key != (char *)0x0 && pHead != (ktxHashList *)0x0) && (valueLen == 0 || value != (void *)0x0)
     ) {
    sVar8 = strlen(key);
    if ((int)sVar8 == 0) {
      return KTX_INVALID_VALUE;
    }
    uVar23 = (int)sVar8 + 1;
    uVar22 = (ulong)uVar23;
    pkVar9 = (ktxHashList)malloc(valueLen + uVar22 + 0x58);
    __dest_00 = pkVar9 + 1;
    pkVar9->key = (char *)__dest_00;
    pkVar9->keyLen = uVar23;
    memcpy(__dest_00,key,uVar22);
    pkVar9->valueLen = valueLen;
    if (valueLen == 0) {
      pkVar9->value = (void *)0x0;
    }
    else {
      __dest = (void *)((long)&__dest_00->keyLen + uVar22);
      pkVar9->value = __dest;
      memcpy(__dest,value,(ulong)valueLen);
      __dest_00 = (ktxHashList)pkVar9->key;
      sVar8 = (size_t)(pkVar9->keyLen - 1);
    }
    pUVar17 = &pkVar9->hh;
    (pkVar9->hh).next = (void *)0x0;
    (pkVar9->hh).key = __dest_00;
    uVar23 = (uint)sVar8;
    (pkVar9->hh).keylen = uVar23;
    if (*pHead == (ktxHashList)0x0) {
      *pHead = pkVar9;
      (pkVar9->hh).prev = (void *)0x0;
      pUVar10 = (UT_hash_table *)calloc(1,0x40);
      (pkVar9->hh).tbl = pUVar10;
      if (pUVar10 == (UT_hash_table *)0x0) goto LAB_001e4775;
      pUVar10->tail = pUVar17;
      pUVar10->num_buckets = 0x20;
      pUVar10->log2_num_buckets = 5;
      pUVar10->hho = 0x20;
      pUVar12 = (UT_hash_bucket *)calloc(1,0x200);
      pUVar10->buckets = pUVar12;
      if (pUVar12 == (UT_hash_bucket *)0x0) goto LAB_001e4775;
      pUVar10->signature = 0xa0111fe1;
      pkVar11 = pkVar9;
    }
    else {
      (((*pHead)->hh).tbl)->tail->next = pkVar9;
      pUVar10 = ((*pHead)->hh).tbl;
      (pkVar9->hh).prev = (void *)((long)pUVar10->tail - pUVar10->hho);
      pUVar10->tail = pUVar17;
      pUVar10 = ((*pHead)->hh).tbl;
      pkVar11 = *pHead;
    }
    pUVar10->num_items = pUVar10->num_items + 1;
    (pkVar9->hh).tbl = pUVar10;
    (pkVar9->hh).hashv = 0xfeedbeef;
    if (uVar23 < 0xc) {
      uVar20 = 0x9e3779b9;
      uVar15 = 0xfeedbeef;
      uVar21 = 0x9e3779b9;
      uVar13 = uVar23;
    }
    else {
      uVar21 = 0x9e3779b9;
      uVar15 = 0xfeedbeef;
      uVar20 = 0x9e3779b9;
      uVar22 = sVar8 & 0xffffffff;
      do {
        iVar14 = (uint)(byte)__dest_00->field_0x7 * 0x1000000 + (char)__dest_00->field_0x6 * 0x10000
                 + (char)__dest_00->field_0x5 * 0x100 + (int)(char)__dest_00->field_0x4 + uVar20;
        uVar13 = (uint)*(byte *)((long)&__dest_00->key + 3) * 0x1000000 +
                 *(char *)((long)&__dest_00->key + 2) * 0x10000 + uVar15 +
                 *(char *)((long)&__dest_00->key + 1) * 0x100 + (int)*(char *)&__dest_00->key;
        uVar21 = uVar13 >> 0xd ^
                 (((uint)*(byte *)((long)&__dest_00->keyLen + 3) * 0x1000000 +
                   *(char *)((long)&__dest_00->keyLen + 2) * 0x10000 +
                  *(char *)((long)&__dest_00->keyLen + 1) * 0x100 +
                  (int)(char)__dest_00->keyLen + uVar21) - iVar14) - uVar13;
        uVar20 = uVar21 << 8 ^ (iVar14 - uVar13) - uVar21;
        uVar15 = uVar20 >> 0xd ^ (uVar13 - uVar21) - uVar20;
        uVar13 = uVar15 >> 0xc ^ (uVar21 - uVar20) - uVar15;
        uVar20 = uVar13 << 0x10 ^ (uVar20 - uVar15) - uVar13;
        uVar15 = uVar20 >> 5 ^ (uVar15 - uVar13) - uVar20;
        uVar21 = uVar15 >> 3 ^ (uVar13 - uVar20) - uVar15;
        uVar20 = uVar21 << 10 ^ (uVar20 - uVar15) - uVar21;
        uVar15 = uVar20 >> 0xf ^ (uVar15 - uVar21) - uVar20;
        (pkVar9->hh).hashv = uVar15;
        __dest_00 = (ktxHashList)((long)&__dest_00->key + 4);
        uVar13 = (int)uVar22 - 0xc;
        uVar22 = (ulong)uVar13;
      } while (0xb < uVar13);
    }
    uVar15 = uVar15 + uVar23;
    (pkVar9->hh).hashv = uVar15;
    switch(uVar13) {
    case 0xb:
      uVar15 = (uint)*(byte *)((long)&__dest_00->key + 2) * 0x1000000 + uVar15;
      (pkVar9->hh).hashv = uVar15;
    case 10:
      uVar15 = *(char *)((long)&__dest_00->key + 1) * 0x10000 + uVar15;
      (pkVar9->hh).hashv = uVar15;
    case 9:
      uVar15 = *(char *)&__dest_00->key * 0x100 + uVar15;
      (pkVar9->hh).hashv = uVar15;
    case 8:
      uVar20 = (uint)(byte)__dest_00->field_0x7 * 0x1000000 + uVar20;
    case 7:
      uVar20 = (char)__dest_00->field_0x6 * 0x10000 + uVar20;
    case 6:
      uVar20 = (char)__dest_00->field_0x5 * 0x100 + uVar20;
    case 5:
      uVar20 = (int)(char)__dest_00->field_0x4 + uVar20;
    case 4:
      uVar21 = (uint)*(byte *)((long)&__dest_00->keyLen + 3) * 0x1000000 + uVar21;
    case 3:
      uVar21 = *(char *)((long)&__dest_00->keyLen + 2) * 0x10000 + uVar21;
    case 2:
      uVar21 = *(char *)((long)&__dest_00->keyLen + 1) * 0x100 + uVar21;
    case 1:
      uVar21 = (int)(char)__dest_00->keyLen + uVar21;
    }
    uVar23 = uVar15 >> 0xd ^ (uVar21 - uVar20) - uVar15;
    uVar20 = uVar23 << 8 ^ (uVar20 - uVar15) - uVar23;
    uVar13 = uVar20 >> 0xd ^ (uVar15 - uVar23) - uVar20;
    uVar23 = uVar13 >> 0xc ^ (uVar23 - uVar20) - uVar13;
    uVar20 = uVar23 << 0x10 ^ (uVar20 - uVar13) - uVar23;
    uVar15 = uVar20 >> 5 ^ (uVar13 - uVar23) - uVar20;
    uVar13 = uVar15 >> 3 ^ (uVar23 - uVar20) - uVar15;
    uVar23 = uVar13 << 10 ^ (uVar20 - uVar15) - uVar13;
    uVar23 = uVar23 >> 0xf ^ uVar15 - (uVar13 + uVar23);
    (pkVar9->hh).hashv = uVar23;
    pUVar3 = (pkVar11->hh).tbl;
    uVar23 = pUVar3->num_buckets - 1 & uVar23;
    pUVar12 = pUVar3->buckets;
    puVar2 = &pUVar12[uVar23].count;
    *puVar2 = *puVar2 + 1;
    pUVar4 = pUVar12[uVar23].hh_head;
    (pkVar9->hh).hh_next = pUVar4;
    (pkVar9->hh).hh_prev = (UT_hash_handle *)0x0;
    if (pUVar4 != (UT_hash_handle *)0x0) {
      pUVar4->hh_prev = pUVar17;
    }
    (((*pHead)->hh).tbl)->buckets[uVar23].hh_head = pUVar17;
    pUVar12 = (((*pHead)->hh).tbl)->buckets;
    kVar18 = KTX_SUCCESS;
    kVar19 = KTX_SUCCESS;
    if ((pUVar12[uVar23].expand_mult * 10 + 10 <= pUVar12[uVar23].count) &&
       (kVar19 = kVar18, pUVar10->noexpand != 1)) {
      uVar23 = pUVar10->num_buckets;
      uVar13 = uVar23 * 2;
      pUVar12 = (UT_hash_bucket *)calloc(1,(ulong)uVar13 << 4);
      if (pUVar12 == (UT_hash_bucket *)0x0) {
LAB_001e4775:
        exit(-1);
      }
      uVar15 = pUVar10->log2_num_buckets + 1;
      uVar20 = ((pUVar10->num_items >> ((byte)uVar15 & 0x1f)) + 1) -
               (uint)((uVar13 - 1 & pUVar10->num_items) == 0);
      pUVar10->ideal_chain_maxlen = uVar20;
      pUVar10->nonideal_items = 0;
      __ptr = pUVar10->buckets;
      if ((ulong)uVar23 != 0) {
        uVar21 = 0;
        uVar22 = 0;
        do {
          pUVar4 = __ptr[uVar22].hh_head;
          while (pUVar4 != (UT_hash_handle *)0x0) {
            pUVar5 = pUVar4->hh_next;
            uVar16 = pUVar4->hashv & uVar13 - 1;
            pUVar1 = pUVar12 + uVar16;
            uVar7 = pUVar12[uVar16].count + 1;
            pUVar12[uVar16].count = uVar7;
            if (uVar20 < uVar7) {
              uVar21 = uVar21 + 1;
              pUVar10->nonideal_items = uVar21;
              pUVar1->expand_mult = uVar7 / uVar20;
            }
            pUVar4->hh_prev = (UT_hash_handle *)0x0;
            pUVar6 = pUVar1->hh_head;
            pUVar4->hh_next = pUVar6;
            if (pUVar6 != (UT_hash_handle *)0x0) {
              pUVar6->hh_prev = pUVar4;
            }
            pUVar1->hh_head = pUVar4;
            pUVar4 = pUVar5;
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar23);
      }
      pUVar10->num_buckets = uVar13;
      pUVar10->log2_num_buckets = uVar15;
      free(__ptr);
      pUVar10 = pUVar17->tbl;
      pUVar10->buckets = pUVar12;
      if (pUVar10->num_items >> 1 < pUVar10->nonideal_items) {
        uVar23 = pUVar10->ineff_expands + 1;
        pUVar10->ineff_expands = uVar23;
        if (1 < uVar23) {
          pUVar10->noexpand = 1;
        }
      }
      else {
        pUVar10->ineff_expands = 0;
      }
    }
  }
  return kVar19;
}

Assistant:

KTX_error_code
ktxHashList_AddKVPair(ktxHashList* pHead, const char* key, unsigned int valueLen, const void* value)
{
    if (pHead && key && (valueLen == 0 || value)) {
        unsigned int keyLen = (unsigned int)strlen(key) + 1;
        ktxKVListEntry* kv;

        if (keyLen == 1)
            return KTX_INVALID_VALUE;   /* Empty string */

        /* Allocate all the memory as a block */
        kv = (ktxKVListEntry*)malloc(sizeof(ktxKVListEntry) + keyLen + valueLen);
        /* Put key first */
        kv->key = (char *)kv + sizeof(ktxKVListEntry);
        kv->keyLen = keyLen;
        memcpy(kv->key, key, keyLen);
        /* then value */
        kv->valueLen = valueLen;
        if (valueLen > 0) {
            kv->value = kv->key + keyLen;
            memcpy(kv->value, value, valueLen);
        } else {
            kv->value = 0;
        }

        HASH_ADD_KEYPTR( hh, *pHead, kv->key, kv->keyLen-1, kv);
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}